

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O1

string * __thiscall cmCTestBZR::LoadInfo_abi_cxx11_(string *__return_storage_ptr__,cmCTestBZR *this)

{
  pointer pcVar1;
  long *plVar2;
  long lVar3;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  string bzr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bzr_revno;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bzr_info;
  OutputLogger rerr;
  OutputLogger ierr;
  RevnoParser rout;
  InfoParser iout;
  long *local_868;
  long local_860;
  long local_858 [2];
  string local_848;
  string local_828;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_808;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_7f0;
  OutputLogger local_7d8;
  OutputLogger local_798;
  undefined1 local_758 [32];
  long *local_738;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_730 [36];
  char *local_4f0;
  undefined1 local_4e0 [32];
  long *local_4c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b8 [36];
  char *local_270;
  char *local_40;
  
  pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_dataplus._M_p;
  local_868 = local_858;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_868,pcVar1,
             pcVar1 + (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_string_length
            );
  local_4e0._0_8_ = local_4e0 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_4e0,local_868,local_860 + (long)local_868);
  plVar2 = (long *)(local_4b8[0]._M_local_buf + 8);
  local_4c0 = plVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c0,"info","");
  __l._M_len = 2;
  __l._M_array = (iterator)local_4e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_7f0,__l,(allocator_type *)local_758);
  lVar3 = -0x40;
  do {
    if (plVar2 != (long *)plVar2[-2]) {
      operator_delete((long *)plVar2[-2],*plVar2 + 1);
    }
    plVar2 = plVar2 + -4;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0);
  InfoParser::InfoParser((InfoParser *)local_4e0,this,"info-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            (&local_798,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"info-err> ");
  local_828._M_string_length = 0;
  local_828.field_2._M_local_buf[0] = '\0';
  local_828._M_dataplus._M_p = (pointer)&local_828.field_2;
  cmCTestVC::RunChild((cmCTestVC *)this,&local_7f0,(OutputParser *)local_4e0,
                      (OutputParser *)&local_798,&local_828,Auto);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_828._M_dataplus._M_p != &local_828.field_2) {
    operator_delete(local_828._M_dataplus._M_p,
                    CONCAT71(local_828.field_2._M_allocated_capacity._1_7_,
                             local_828.field_2._M_local_buf[0]) + 1);
  }
  local_758._0_8_ = local_758 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_758,local_868,local_860 + (long)local_868);
  plVar2 = (long *)(local_730[0]._M_local_buf + 8);
  local_738 = plVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_738,"revno","");
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)local_758;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_808,__l_00,(allocator_type *)&local_7d8);
  lVar3 = -0x40;
  do {
    if (plVar2 != (long *)plVar2[-2]) {
      operator_delete((long *)plVar2[-2],*plVar2 + 1);
    }
    plVar2 = plVar2 + -4;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  RevnoParser::RevnoParser((RevnoParser *)local_758,this,"revno-out> ",__return_storage_ptr__);
  cmProcessTools::OutputLogger::OutputLogger
            (&local_7d8,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"revno-err> ");
  local_848._M_string_length = 0;
  local_848.field_2._M_local_buf[0] = '\0';
  local_848._M_dataplus._M_p = (pointer)&local_848.field_2;
  cmCTestVC::RunChild((cmCTestVC *)this,&local_808,(OutputParser *)local_758,
                      (OutputParser *)&local_7d8,&local_848,Auto);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_848._M_dataplus._M_p != &local_848.field_2) {
    operator_delete(local_848._M_dataplus._M_p,
                    CONCAT71(local_848.field_2._M_allocated_capacity._1_7_,
                             local_848.field_2._M_local_buf[0]) + 1);
  }
  local_7d8.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_00b3d268;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d8.super_LineParser.Line._M_dataplus._M_p !=
      &local_7d8.super_LineParser.Line.field_2) {
    operator_delete(local_7d8.super_LineParser.Line._M_dataplus._M_p,
                    local_7d8.super_LineParser.Line.field_2._M_allocated_capacity + 1);
  }
  local_758._0_8_ = &PTR__RevnoParser_00b394d8;
  if (local_4f0 != (char *)0x0) {
    operator_delete__(local_4f0);
  }
  local_758._0_8_ = &PTR__LineParser_00b3d268;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_758._24_8_ != local_730) {
    operator_delete((void *)local_758._24_8_,local_730[0]._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_808);
  local_798.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_00b3d268;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_798.super_LineParser.Line._M_dataplus._M_p !=
      &local_798.super_LineParser.Line.field_2) {
    operator_delete(local_798.super_LineParser.Line._M_dataplus._M_p,
                    local_798.super_LineParser.Line.field_2._M_allocated_capacity + 1);
  }
  local_4e0._0_8_ = &PTR__InfoParser_00b39490;
  if (local_40 != (char *)0x0) {
    operator_delete__(local_40);
  }
  if (local_270 != (char *)0x0) {
    operator_delete__(local_270);
  }
  local_4e0._0_8_ = &PTR__LineParser_00b3d268;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0._24_8_ != local_4b8) {
    operator_delete((void *)local_4e0._24_8_,local_4b8[0]._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_7f0);
  if (local_868 != local_858) {
    operator_delete(local_868,local_858[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestBZR::LoadInfo()
{
  // Run "bzr info" to get the repository info from the work tree.
  std::string bzr = this->CommandLineTool;
  std::vector<std::string> bzr_info = { bzr, "info" };
  InfoParser iout(this, "info-out> ");
  OutputLogger ierr(this->Log, "info-err> ");
  this->RunChild(bzr_info, &iout, &ierr);

  // Run "bzr revno" to get the repository revision number from the work tree.
  std::vector<std::string> bzr_revno = { bzr, "revno" };
  std::string rev;
  RevnoParser rout(this, "revno-out> ", rev);
  OutputLogger rerr(this->Log, "revno-err> ");
  this->RunChild(bzr_revno, &rout, &rerr);

  return rev;
}